

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O1

void __thiscall
duckdb::BaseScanner::ParseChunkInternal<duckdb::StringValueResult>
          (BaseScanner *this,StringValueResult *result)

{
  if ((this->iterator).done != false) {
    return;
  }
  if (this->initialized == false) {
    (*this->_vptr_BaseScanner[4])(this);
    this->initialized = true;
  }
  if (((this->iterator).done == false) &&
     ((this->cur_buffer_handle).internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    Process<duckdb::StringValueResult>(this,result);
  }
  (*this->_vptr_BaseScanner[5])(this);
  return;
}

Assistant:

void ParseChunkInternal(T &result) {
		if (iterator.done) {
			return;
		}
		if (!initialized) {
			Initialize();
			initialized = true;
		}
		if (!iterator.done && cur_buffer_handle) {
			Process(result);
		}
		FinalizeChunkProcess();
	}